

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

Float pbrt::HairBxDF::Mp(Float cosTheta_i,Float cosTheta_o,Float sinTheta_i,Float sinTheta_o,Float v
                        )

{
  undefined1 auVar1 [16];
  Float FVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = (cosTheta_i * cosTheta_o) / v;
  fVar3 = (sinTheta_i * sinTheta_o) / v;
  if (v <= 0.1) {
    FVar2 = LogI0(fVar4);
    fVar4 = logf(1.0 / (v + v));
    fVar3 = FastExp(fVar4 + ((FVar2 - fVar3) - 1.0 / v) + 0.6931);
  }
  else {
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    auVar1 = vxorps_avx512vl(ZEXT416((uint)fVar3),auVar1);
    fVar3 = FastExp(auVar1._0_4_);
    FVar2 = I0(fVar4);
    fVar4 = sinhf(1.0 / v);
    fVar3 = (FVar2 * fVar3) / ((fVar4 + fVar4) * v);
  }
  if ((uint)ABS(fVar3) < 0x7f800000) {
    return fVar3;
  }
  LogFatal<char_const(&)[25]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.h"
             ,0x3ec,"Check failed: %s",(char (*) [25])"!IsInf(mp) && !IsNaN(mp)");
}

Assistant:

PBRT_CPU_GPU
    static Float Mp(Float cosTheta_i, Float cosTheta_o, Float sinTheta_i,
                    Float sinTheta_o, Float v) {
        Float a = cosTheta_i * cosTheta_o / v;
        Float b = sinTheta_i * sinTheta_o / v;
        Float mp = (v <= .1)
                       ? (FastExp(LogI0(a) - b - 1 / v + 0.6931f + std::log(1 / (2 * v))))
                       : (FastExp(-b) * I0(a)) / (std::sinh(1 / v) * 2 * v);
        CHECK(!IsInf(mp) && !IsNaN(mp));
        return mp;
    }